

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_xts_setkey_dec(mbedtls_aes_xts_context *ctx,uchar *key,uint keybits)

{
  bool bVar1;
  int iVar2;
  undefined4 in_register_00000014;
  uchar *key_00;
  uint unaff_EBP;
  
  key_00 = (uchar *)CONCAT44(in_register_00000014,keybits);
  iVar2 = 0;
  if ((keybits == 0x200) || (keybits == 0x100)) {
    unaff_EBP = keybits >> 1;
    key_00 = key + (keybits >> 4);
    bVar1 = true;
  }
  else {
    iVar2 = -0x20;
    bVar1 = false;
  }
  if (bVar1) {
    iVar2 = mbedtls_aes_setkey_enc(&ctx->tweak,key_00,unaff_EBP);
    if (iVar2 == 0) {
      iVar2 = mbedtls_aes_setkey_dec(&ctx->crypt,key,unaff_EBP);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_aes_xts_setkey_dec( mbedtls_aes_xts_context *ctx,
                                const unsigned char *key,
                                unsigned int keybits)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *key1, *key2;
    unsigned int key1bits, key2bits;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( key != NULL );

    ret = mbedtls_aes_xts_decode_keys( key, keybits, &key1, &key1bits,
                                       &key2, &key2bits );
    if( ret != 0 )
        return( ret );

    /* Set the tweak key. Always set tweak key for encryption. */
    ret = mbedtls_aes_setkey_enc( &ctx->tweak, key2, key2bits );
    if( ret != 0 )
        return( ret );

    /* Set crypt key for decryption. */
    return mbedtls_aes_setkey_dec( &ctx->crypt, key1, key1bits );
}